

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Raw.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Raw::list
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Raw *this,Path *path)

{
  Client *client;
  Url local_40;
  Path *local_20;
  Path *path_local;
  Raw *this_local;
  
  client = *(Client **)this;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (Raw *)__return_storage_ptr__;
  getUrl(&local_40,this,path);
  HttpConsumer::list(__return_storage_ptr__,client,&local_40);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::Raw::list(const Path &path) {
  return HttpConsumer::list(client_, getUrl(path));
}